

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlStringCurrentChar(xmlParserCtxtPtr ctxt,xmlChar *cur,int *len)

{
  int local_30;
  int c;
  int *len_local;
  xmlChar *cur_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((cur == (xmlChar *)0x0) || (len == (int *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    *len = 4;
    local_30 = xmlGetUTF8Char(cur,len);
    if (local_30 < 0) {
      local_30 = 0;
    }
    ctxt_local._4_4_ = local_30;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlStringCurrentChar(xmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                     const xmlChar *cur, int *len) {
    int c;

    if ((cur == NULL) || (len == NULL))
        return(0);

    /* cur is zero-terminated, so we can lie about its length. */
    *len = 4;
    c = xmlGetUTF8Char(cur, len);

    return((c < 0) ? 0 : c);
}